

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O0

void Nwk_ManFree(Nwk_Man_t *p)

{
  Nwk_Man_t *p_local;
  
  if ((p->pName != (char *)0x0) && (p->pName != (char *)0x0)) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if ((p->pSpec != (char *)0x0) && (p->pSpec != (char *)0x0)) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->vCis != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCis);
  }
  if (p->vCos != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCos);
  }
  if (p->vObjs != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vObjs);
  }
  if (p->vTemp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vTemp);
  }
  if (p->pManTime != (Tim_Man_t *)0x0) {
    Tim_ManStop(p->pManTime);
  }
  if (p->pMemObjs != (Aig_MmFlex_t *)0x0) {
    Aig_MmFlexStop(p->pMemObjs,0);
  }
  if (p->pManHop != (Hop_Man_t *)0x0) {
    Hop_ManStop(p->pManHop);
  }
  if (p != (Nwk_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Nwk_ManFree( Nwk_Man_t * p )
{
//    printf( "The number of realloced nodes = %d.\n", p->nRealloced );
    if ( p->pName )    ABC_FREE( p->pName );
    if ( p->pSpec )    ABC_FREE( p->pSpec );
    if ( p->vCis )     Vec_PtrFree( p->vCis );
    if ( p->vCos )     Vec_PtrFree( p->vCos );
    if ( p->vObjs )    Vec_PtrFree( p->vObjs );
    if ( p->vTemp )    Vec_PtrFree( p->vTemp );
    if ( p->pManTime ) Tim_ManStop( p->pManTime );
    if ( p->pMemObjs ) Aig_MmFlexStop( p->pMemObjs, 0 );
    if ( p->pManHop )  Hop_ManStop( p->pManHop );
    ABC_FREE( p );
}